

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O3

void __thiscall gamespace::GameScreenInputState::idle(GameScreenInputState *this)

{
  if (this->_movementmask[0] == true) {
    qe::Camera::moveUp((this->_impl->_cam).camera._M_t.
                       super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
                       super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
                       super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
                       this->_impl->_ctxt->_deltat * 10.0);
  }
  if (this->_movementmask[1] == true) {
    qe::Camera::moveDown
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
               this->_impl->_ctxt->_deltat * 10.0);
  }
  if (this->_movementmask[2] == true) {
    qe::Camera::moveLeft
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
               this->_impl->_ctxt->_deltat * 10.0);
  }
  if (this->_movementmask[3] == true) {
    qe::Camera::moveRight
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
               this->_impl->_ctxt->_deltat * 10.0);
  }
  if (this->_movementmask[4] == true) {
    qe::Camera::moveForward
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
               this->_impl->_ctxt->_deltat * 10.0);
  }
  if (this->_movementmask[5] == true) {
    qe::Camera::moveBackward
              ((this->_impl->_cam).camera._M_t.
               super___uniq_ptr_impl<qe::Camera,_std::default_delete<qe::Camera>_>._M_t.
               super__Tuple_impl<0UL,_qe::Camera_*,_std::default_delete<qe::Camera>_>.
               super__Head_base<0UL,_qe::Camera_*,_false>._M_head_impl,
               this->_impl->_ctxt->_deltat * 10.0);
    return;
  }
  return;
}

Assistant:

void GameScreenInputState::idle() {
    if(_movementmask[MOVEUP]) _impl->camera()->moveUp(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEDOWN]) _impl->camera()->moveDown(10 * _impl->context()->deltaT());
    if(_movementmask[MOVELEFT]) _impl->camera()->moveLeft(10 * _impl->context()->deltaT());
    if(_movementmask[MOVERIGHT]) _impl->camera()->moveRight(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEFORWARD]) _impl->camera()->moveForward(10 * _impl->context()->deltaT());
    if(_movementmask[MOVEBACKWARD]) _impl->camera()->moveBackward(10 * _impl->context()->deltaT());
}